

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

pair<double,_double> __thiscall
HPresolve::getBoundsImpliedFree(HPresolve *this,double lowInit,double uppInit,int col,int i,int k)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  pair<double,_double> pVar33;
  
  uVar16 = (ulong)i;
  piVar2 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (long)(this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  uVar23 = uVar16;
  if ((uVar13 <= uVar16) || (uVar23 = (ulong)(i + 1), uVar13 <= uVar23)) {
LAB_0014297f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar23,
               uVar13);
  }
  iVar1 = piVar2[uVar16];
  uVar27 = (ulong)iVar1;
  iVar25 = piVar2[uVar23];
  piVar2 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar24 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  piVar4 = (this->implColLowerRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar17 = (long)(this->implColLowerRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  pdVar5 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar18 = (long)(this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
  pdVar6 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar19 = (long)(this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
  piVar7 = (this->implColUpperRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = (long)(this->implColUpperRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
  pdVar8 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar20 = (long)(this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
  pdVar9 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar21 = (long)(this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
  uVar28 = (ulong)k;
  pdVar10 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar22 = (long)(this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
  pdVar11 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar26 = (long)(this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
  uVar16 = uVar27;
  if (uVar27 < uVar14) {
    uVar16 = uVar14;
  }
  iVar12 = iVar25;
  if (iVar25 < iVar1) {
    iVar12 = iVar1;
  }
  if (iVar1 < iVar25) {
    uVar29 = uVar27;
    do {
      uVar13 = uVar14;
      uVar23 = uVar16;
      if (uVar14 <= uVar29) goto LAB_0014297f;
      uVar23 = (ulong)piVar2[uVar29];
      uVar13 = uVar24;
      if (uVar24 <= uVar23) goto LAB_0014297f;
      if ((piVar2[uVar29] != col) && (piVar3[uVar23] != 0)) {
        uVar13 = uVar17;
        if (uVar17 <= uVar23) goto LAB_0014297f;
        if (piVar4[uVar23] == i) {
          uVar13 = uVar18;
          if (uVar18 <= uVar23) goto LAB_0014297f;
          dVar30 = pdVar5[uVar23];
        }
        else {
          uVar13 = uVar18;
          if ((uVar18 <= uVar23) || (uVar13 = uVar19, uVar19 <= uVar23)) goto LAB_0014297f;
          dVar30 = pdVar6[uVar23];
          if (pdVar6[uVar23] <= pdVar5[uVar23]) {
            dVar30 = pdVar5[uVar23];
          }
        }
        uVar13 = uVar15;
        if (uVar15 <= uVar23) goto LAB_0014297f;
        if (piVar7[uVar23] == i) {
          uVar13 = uVar20;
          if (uVar20 <= uVar23) goto LAB_0014297f;
          dVar31 = pdVar8[uVar23];
        }
        else {
          uVar13 = uVar20;
          if ((uVar20 <= uVar23) || (uVar13 = uVar21, uVar21 <= uVar23)) goto LAB_0014297f;
          dVar31 = pdVar9[uVar23];
          if (pdVar8[uVar23] <= pdVar9[uVar23]) {
            dVar31 = pdVar8[uVar23];
          }
        }
        uVar13 = uVar22;
        uVar23 = uVar28;
        if (uVar22 <= uVar28) goto LAB_0014297f;
        uVar23 = uVar29;
        if (0.0 <= pdVar10[uVar28]) {
LAB_001426d3:
          if (0.0 < pdVar10[uVar28]) {
            uVar13 = uVar26;
            if (uVar26 <= uVar29) goto LAB_0014297f;
            dVar32 = pdVar11[uVar29];
            if (dVar32 < 0.0) goto LAB_001426f4;
          }
          if ((dVar31 == 1e+200) && (!NAN(dVar31))) goto LAB_0014273d;
          uVar13 = uVar26;
          if (uVar26 <= uVar29) goto LAB_0014297f;
          lowInit = lowInit - dVar31 * pdVar11[uVar29];
        }
        else {
          uVar13 = uVar26;
          if (uVar26 <= uVar29) goto LAB_0014297f;
          dVar32 = pdVar11[uVar29];
          if (dVar32 <= 0.0) goto LAB_001426d3;
LAB_001426f4:
          if ((dVar30 == -1e+200) && (!NAN(dVar30))) {
LAB_0014273d:
            lowInit = -1e+200;
            break;
          }
          uVar13 = uVar26;
          if (uVar26 <= uVar29) goto LAB_0014297f;
          lowInit = lowInit - dVar32 * dVar30;
        }
      }
      uVar29 = uVar29 + 1;
    } while ((long)iVar12 != uVar29);
  }
  if (iVar1 < iVar25) {
    iVar25 = iVar25 - iVar1;
    do {
      uVar13 = uVar14;
      uVar23 = uVar16;
      if (uVar14 <= uVar27) goto LAB_0014297f;
      uVar23 = (ulong)piVar2[uVar27];
      uVar13 = uVar24;
      if (uVar24 <= uVar23) goto LAB_0014297f;
      if ((piVar2[uVar27] != col) && (piVar3[uVar23] != 0)) {
        uVar13 = uVar17;
        if (uVar17 <= uVar23) goto LAB_0014297f;
        if (piVar4[uVar23] == i) {
          uVar13 = uVar18;
          if (uVar18 <= uVar23) goto LAB_0014297f;
          dVar30 = pdVar5[uVar23];
        }
        else {
          uVar13 = uVar18;
          if ((uVar18 <= uVar23) || (uVar13 = uVar19, uVar19 <= uVar23)) goto LAB_0014297f;
          dVar30 = pdVar6[uVar23];
          if (pdVar6[uVar23] <= pdVar5[uVar23]) {
            dVar30 = pdVar5[uVar23];
          }
        }
        uVar13 = uVar15;
        if (uVar15 <= uVar23) goto LAB_0014297f;
        if (piVar7[uVar23] == i) {
          uVar13 = uVar20;
          if (uVar20 <= uVar23) goto LAB_0014297f;
          dVar31 = pdVar8[uVar23];
        }
        else {
          uVar13 = uVar20;
          if ((uVar20 <= uVar23) || (uVar13 = uVar21, uVar21 <= uVar23)) goto LAB_0014297f;
          dVar31 = pdVar9[uVar23];
          if (pdVar8[uVar23] <= pdVar9[uVar23]) {
            dVar31 = pdVar8[uVar23];
          }
        }
        uVar13 = uVar22;
        uVar23 = uVar28;
        if (uVar22 <= uVar28) goto LAB_0014297f;
        uVar23 = uVar27;
        if (0.0 <= pdVar10[uVar28]) {
LAB_0014286a:
          if (0.0 < pdVar10[uVar28]) {
            uVar13 = uVar26;
            if (uVar26 <= uVar27) goto LAB_0014297f;
            dVar32 = pdVar11[uVar27];
            if (dVar32 < 0.0) goto LAB_0014288b;
          }
          if ((dVar30 == -1e+200) && (!NAN(dVar30))) goto LAB_001428d4;
          uVar13 = uVar26;
          if (uVar26 <= uVar27) goto LAB_0014297f;
          uppInit = uppInit - dVar30 * pdVar11[uVar27];
        }
        else {
          uVar13 = uVar26;
          if (uVar26 <= uVar27) goto LAB_0014297f;
          dVar32 = pdVar11[uVar27];
          if (dVar32 <= 0.0) goto LAB_0014286a;
LAB_0014288b:
          if ((dVar31 == 1e+200) && (!NAN(dVar31))) {
LAB_001428d4:
            uppInit = 1e+200;
            break;
          }
          uVar13 = uVar26;
          if (uVar26 <= uVar27) goto LAB_0014297f;
          uppInit = uppInit - dVar32 * dVar31;
        }
      }
      uVar27 = uVar27 + 1;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
  }
  pVar33.second = uppInit;
  pVar33.first = lowInit;
  return pVar33;
}

Assistant:

pair<double, double> HPresolve::getBoundsImpliedFree(double lowInit, double uppInit,
											const int col, const int i, const int k) {
	double low = lowInit;
	double upp = uppInit;

	//use implied bounds with original bounds
	int j;
	double l,u;
	// if at any stage low becomes  or upp becomes inf break loop  
	// can't use bounds for variables generated by the same row. 
	//low
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
		
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (l==-HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*l;
			else 
				if (u==HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*u;
		}
	}
	//upp
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
			// if at any stage low becomes  or upp becomes inf it's not implied free 
			//low:: 
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (u==HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*u;
			else 
				if (l==-HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*l;
		}
	}
	return make_pair(low, upp);
}